

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O3

int xmlIOHTTPCloseWrite(void *context,char *http_mthd)

{
  xmlZMemBuffPtr buff;
  uint uVar1;
  int iVar2;
  uchar *input;
  unsigned_long uVar3;
  uLong uVar4;
  void *ctx;
  char *headers;
  Bytef *pBVar5;
  size_t sVar6;
  xmlOutputBufferPtr dctxt;
  char *content_type;
  xmlChar msg [500];
  
  content_type = "text/xml";
  if (http_mthd == (char *)0x0 || context == (void *)0x0) {
    return -1;
  }
  buff = *(xmlZMemBuffPtr *)((long)context + 0x10);
  if (*context < 1) {
    input = xmlBufContent(*(xmlBuf **)&(buff->zctrl).avail_in);
    sVar6 = xmlBufUse(*(xmlBufPtr *)&(buff->zctrl).avail_in);
    headers = (char *)0x0;
LAB_00199775:
    if (input == (uchar *)0x0) goto LAB_00199873;
    ctx = xmlNanoHTTPMethod(*(char **)((long)context + 8),http_mthd,(char *)input,&content_type,
                            headers,(int)sVar6);
    if (ctx != (void *)0x0) {
      uVar1 = xmlNanoHTTPReturnCode(ctx);
      iVar2 = 0;
      if (99 < uVar1 - 200) {
        xmlStrPrintf(msg,500,"xmlIOHTTPCloseWrite: HTTP \'%s\' of %d %s\n\'%s\' %s %d\n",http_mthd,
                     sVar6 & 0xffffffff,"bytes to URI",*(undefined8 *)((long)context + 8),
                     "failed.  HTTP return code:",(ulong)uVar1);
        __xmlSimpleError(8,0x60a,(xmlNodePtr)0x0,"write error",(char *)msg);
        iVar2 = -1;
      }
      xmlNanoHTTPClose(ctx);
      (*xmlFree)(content_type);
      goto LAB_001998ca;
    }
  }
  else {
    if (buff != (xmlZMemBuffPtr)0x0) {
      do {
        uVar1 = deflate(&buff->zctrl,4);
        if (uVar1 != 0) {
          if (uVar1 == 1) {
            if ((0xf < (buff->zctrl).avail_out) ||
               (iVar2 = xmlZMemBuffExtend(buff,0x10), iVar2 != -1)) {
              uVar3 = buff->crc;
              pBVar5 = (buff->zctrl).next_out;
              iVar2 = 4;
              do {
                *pBVar5 = (Bytef)uVar3;
                uVar3 = uVar3 >> 8;
                pBVar5 = (buff->zctrl).next_out + 1;
                (buff->zctrl).next_out = pBVar5;
                iVar2 = iVar2 + -1;
              } while (iVar2 != 0);
              uVar4 = (buff->zctrl).total_in;
              iVar2 = 4;
              do {
                *pBVar5 = (Bytef)uVar4;
                uVar4 = uVar4 >> 8;
                pBVar5 = (buff->zctrl).next_out + 1;
                (buff->zctrl).next_out = pBVar5;
                iVar2 = iVar2 + -1;
              } while (iVar2 != 0);
              input = buff->zbuff;
              sVar6 = (long)pBVar5 - (long)input;
              headers = "Content-Encoding: gzip";
              goto LAB_00199775;
            }
          }
          else {
            xmlStrPrintf(msg,500,"xmlZMemBuffGetContent:  %s - %d\n",
                         "Error flushing zlib buffers.  Error code",(ulong)uVar1);
            __xmlSimpleError(8,0x60a,(xmlNodePtr)0x0,"write error",(char *)msg);
          }
          break;
        }
        iVar2 = xmlZMemBuffExtend(buff,buff->size);
      } while (iVar2 != -1);
    }
LAB_00199873:
    xmlStrPrintf(msg,500,"xmlIOHTTPCloseWrite:  %s \'%s\' %s \'%s\'.\n",
                 "Error retrieving content.\nUnable to",http_mthd,"data to URI",
                 *(undefined8 *)((long)context + 8));
    __xmlSimpleError(8,0x60a,(xmlNodePtr)0x0,"write error",(char *)msg);
  }
  iVar2 = -1;
LAB_001998ca:
  xmlFreeHTTPWriteCtxt((xmlIOHTTPWriteCtxtPtr)context);
  return iVar2;
}

Assistant:

static int
xmlIOHTTPCloseWrite( void * context, const char * http_mthd ) {

    int				close_rc = -1;
    int				http_rtn = 0;
    int				content_lgth = 0;
    xmlIOHTTPWriteCtxtPtr	ctxt = context;

    char *			http_content = NULL;
    char *			content_encoding = NULL;
    char *			content_type = (char *) "text/xml";
    void *			http_ctxt = NULL;

    if ( ( ctxt == NULL ) || ( http_mthd == NULL ) )
	return ( -1 );

    /*  Retrieve the content from the appropriate buffer  */

#ifdef LIBXML_ZLIB_ENABLED

    if ( ctxt->compression > 0 ) {
	content_lgth = xmlZMemBuffGetContent( ctxt->doc_buff, &http_content );
	content_encoding = (char *) "Content-Encoding: gzip";
    }
    else
#endif
    {
	/*  Pull the data out of the memory output buffer  */

	xmlOutputBufferPtr	dctxt = ctxt->doc_buff;
	http_content = (char *) xmlBufContent(dctxt->buffer);
	content_lgth = xmlBufUse(dctxt->buffer);
    }

    if ( http_content == NULL ) {
	xmlChar msg[500];
	xmlStrPrintf(msg, 500,
		     "xmlIOHTTPCloseWrite:  %s '%s' %s '%s'.\n",
		     "Error retrieving content.\nUnable to",
		     http_mthd, "data to URI", ctxt->uri );
	xmlIOErr(XML_IO_WRITE, (const char *) msg);
    }

    else {

	http_ctxt = xmlNanoHTTPMethod( ctxt->uri, http_mthd, http_content,
					&content_type, content_encoding,
					content_lgth );

	if ( http_ctxt != NULL ) {
#ifdef DEBUG_HTTP
	    /*  If testing/debugging - dump reply with request content  */

	    FILE *	tst_file = NULL;
	    char	buffer[ 4096 ];
	    char *	dump_name = NULL;
	    int		avail;

	    xmlGenericError( xmlGenericErrorContext,
			"xmlNanoHTTPCloseWrite:  HTTP %s to\n%s returned %d.\n",
			http_mthd, ctxt->uri,
			xmlNanoHTTPReturnCode( http_ctxt ) );

	    /*
	    **  Since either content or reply may be gzipped,
	    **  dump them to separate files instead of the
	    **  standard error context.
	    */

	    dump_name = tempnam( NULL, "lxml" );
	    if ( dump_name != NULL ) {
		(void)snprintf( buffer, sizeof(buffer), "%s.content", dump_name );

		tst_file = fopen( buffer, "wb" );
		if ( tst_file != NULL ) {
		    xmlGenericError( xmlGenericErrorContext,
			"Transmitted content saved in file:  %s\n", buffer );

		    fwrite( http_content, 1, content_lgth, tst_file );
		    fclose( tst_file );
		}

		(void)snprintf( buffer, sizeof(buffer), "%s.reply", dump_name );
		tst_file = fopen( buffer, "wb" );
		if ( tst_file != NULL ) {
		    xmlGenericError( xmlGenericErrorContext,
			"Reply content saved in file:  %s\n", buffer );


		    while ( (avail = xmlNanoHTTPRead( http_ctxt,
					buffer, sizeof( buffer ) )) > 0 ) {

			fwrite( buffer, 1, avail, tst_file );
		    }

		    fclose( tst_file );
		}

		free( dump_name );
	    }
#endif  /*  DEBUG_HTTP  */

	    http_rtn = xmlNanoHTTPReturnCode( http_ctxt );
	    if ( ( http_rtn >= 200 ) && ( http_rtn < 300 ) )
		close_rc = 0;
	    else {
                xmlChar msg[500];
                xmlStrPrintf(msg, 500,
                      "xmlIOHTTPCloseWrite: HTTP '%s' of %d %s\n'%s' %s %d\n",
			    http_mthd, content_lgth,
			    "bytes to URI", ctxt->uri,
			    "failed.  HTTP return code:", http_rtn );
		xmlIOErr(XML_IO_WRITE, (const char *) msg);
            }

	    xmlNanoHTTPClose( http_ctxt );
	    xmlFree( content_type );
	}
    }

    /*  Final cleanups  */

    xmlFreeHTTPWriteCtxt( ctxt );

    return ( close_rc );
}